

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O2

EShLanguage Diligent::GLSLangUtils::anon_unknown_3::ShaderTypeToShLanguage(SHADER_TYPE ShaderType)

{
  EShLanguage EVar1;
  string msg;
  
  switch(ShaderType) {
  case SHADER_TYPE_VERTEX:
    EVar1 = EShLangVertex;
    break;
  case SHADER_TYPE_PIXEL:
    EVar1 = EShLangFragment;
    break;
  case SHADER_TYPE_VS_PS:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VS_PS:
switchD_00323eed_caseD_3:
    FormatString<char[23]>(&msg,(char (*) [23])"Unexpected shader type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ShaderTypeToShLanguage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x69);
    goto LAB_00323f1e;
  case SHADER_TYPE_GEOMETRY:
    EVar1 = EShLangGeometry;
    break;
  case SHADER_TYPE_HULL:
    EVar1 = EShLangTessControl;
    break;
  default:
    if (ShaderType == SHADER_TYPE_DOMAIN) {
      return EShLangTessEvaluation;
    }
    if (ShaderType == SHADER_TYPE_COMPUTE) {
      return EShLangCompute;
    }
    if (ShaderType == SHADER_TYPE_AMPLIFICATION) {
      return EShLangTask;
    }
    if (ShaderType == SHADER_TYPE_MESH) {
      return EShLangMesh;
    }
    if (ShaderType == SHADER_TYPE_RAY_GEN) {
      return EShLangRayGen;
    }
    if (ShaderType == SHADER_TYPE_RAY_MISS) {
      return EShLangMiss;
    }
    if (ShaderType == SHADER_TYPE_RAY_CLOSEST_HIT) {
      return EShLangClosestHit;
    }
    if (ShaderType == SHADER_TYPE_RAY_ANY_HIT) {
      return EShLangAnyHit;
    }
    if (ShaderType == SHADER_TYPE_RAY_INTERSECTION) {
      return EShLangIntersect;
    }
    if (ShaderType == SHADER_TYPE_CALLABLE) {
      return EShLangCallable;
    }
    if (ShaderType != SHADER_TYPE_LAST) goto switchD_00323eed_caseD_3;
    FormatString<char[24]>(&msg,(char (*) [24])"Unsupported shader type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ShaderTypeToShLanguage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x66);
LAB_00323f1e:
    std::__cxx11::string::~string((string *)&msg);
    EVar1 = EShLangCount;
  }
  return EVar1;
}

Assistant:

EShLanguage ShaderTypeToShLanguage(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please handle the new shader type in the switch below");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return EShLangVertex;
        case SHADER_TYPE_HULL:             return EShLangTessControl;
        case SHADER_TYPE_DOMAIN:           return EShLangTessEvaluation;
        case SHADER_TYPE_GEOMETRY:         return EShLangGeometry;
        case SHADER_TYPE_PIXEL:            return EShLangFragment;
        case SHADER_TYPE_COMPUTE:          return EShLangCompute;
        case SHADER_TYPE_AMPLIFICATION:    return EShLangTaskNV;
        case SHADER_TYPE_MESH:             return EShLangMeshNV;
        case SHADER_TYPE_RAY_GEN:          return EShLangRayGen;
        case SHADER_TYPE_RAY_MISS:         return EShLangMiss;
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return EShLangClosestHit;
        case SHADER_TYPE_RAY_ANY_HIT:      return EShLangAnyHit;
        case SHADER_TYPE_RAY_INTERSECTION: return EShLangIntersect;
        case SHADER_TYPE_CALLABLE:         return EShLangCallable;
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return EShLangCount;
        default:
            UNEXPECTED("Unexpected shader type");
            return EShLangCount;
    }
}